

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::internal::TracingMuxerImpl::DestroyTracingSession
          (TracingMuxerImpl *this,TracingSessionGlobalID session_id)

{
  bool bVar1;
  reference pRVar2;
  reference this_00;
  pointer pCVar3;
  unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>
  *con;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>,_std::allocator<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>_>_>
  *__range3;
  ConsumerImpl *consumer;
  RegisteredBackend *backend;
  iterator __end2;
  iterator __begin2;
  vector<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
  *__range2;
  TracingSessionGlobalID session_id_local;
  TracingMuxerImpl *this_local;
  
  __end2 = std::
           vector<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
           ::begin(&this->backends_);
  backend = (RegisteredBackend *)
            std::
            vector<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
            ::end(&this->backends_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<perfetto::internal::TracingMuxerImpl::RegisteredBackend_*,_std::vector<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>_>
                                *)&backend);
    if (!bVar1) {
      return;
    }
    pRVar2 = __gnu_cxx::
             __normal_iterator<perfetto::internal::TracingMuxerImpl::RegisteredBackend_*,_std::vector<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>_>
             ::operator*(&__end2);
    __range3 = (vector<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>,_std::allocator<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>_>_>
                *)0x0;
    __end3 = std::
             vector<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>,_std::allocator<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>_>_>
             ::begin(&pRVar2->consumers);
    con = (unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>
           *)std::
             vector<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>,_std::allocator<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>_>_>
             ::end(&pRVar2->consumers);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>_*,_std::vector<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>,_std::allocator<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>_>_>_>
                                       *)&con), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>_*,_std::vector<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>,_std::allocator<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>_>_>_>
                ::operator*(&__end3);
      pCVar3 = std::
               unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>
               ::operator->(this_00);
      if (pCVar3->session_id_ == session_id) {
        __range3 = (vector<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>,_std::allocator<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>_>_>
                    *)std::
                      unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>
                      ::get(this_00);
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>_*,_std::vector<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>,_std::allocator<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>_>_>_>
      ::operator++(&__end3);
    }
    if (__range3 !=
        (vector<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>,_std::allocator<std::unique_ptr<perfetto::internal::TracingMuxerImpl::ConsumerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ConsumerImpl>_>_>_>
         *)0x0) {
      ConsumerImpl::Disconnect((ConsumerImpl *)__range3);
    }
    __gnu_cxx::
    __normal_iterator<perfetto::internal::TracingMuxerImpl::RegisteredBackend_*,_std::vector<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void TracingMuxerImpl::DestroyTracingSession(
    TracingSessionGlobalID session_id) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  for (RegisteredBackend& backend : backends_) {
    // We need to find the consumer (if any) and call Disconnect as we destroy
    // the tracing session. We can't call Disconnect() inside this for loop
    // because in the in-process case this will end up to a synchronous call to
    // OnConsumerDisconnect which will invalidate all the iterators to
    // |backend.consumers|.
    ConsumerImpl* consumer = nullptr;
    for (auto& con : backend.consumers) {
      if (con->session_id_ == session_id) {
        consumer = con.get();
        break;
      }
    }
    if (consumer) {
      // We broke out of the loop above on the assumption that each backend will
      // only have a single consumer per session. This DCHECK ensures that
      // this is the case.
      PERFETTO_DCHECK(
          std::count_if(backend.consumers.begin(), backend.consumers.end(),
                        [session_id](const std::unique_ptr<ConsumerImpl>& con) {
                          return con->session_id_ == session_id;
                        }) == 1u);
      consumer->Disconnect();
    }
  }
}